

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O0

_Bool rtr_pdu_check_size(pdu_header *pdu)

{
  long lVar1;
  uint16_t uVar2;
  pdu_type pVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  long in_FS_OFFSET;
  _Bool _Var6;
  uint16_t asn_count;
  uint32_t err_msg_len;
  uint32_t enc_pdu_len;
  size_t expected_size;
  _Bool retval;
  pdu_aspa *aspa_pdu;
  pdu_error *err_pdu;
  pdu_type type;
  pdu_header *pdu_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVar3 = rtr_get_pdu_type(pdu);
  _Var6 = false;
  switch(pVar3) {
  case SERIAL_NOTIFY:
    _Var6 = pdu->len == 0xc;
    break;
  case SERIAL_QUERY:
    _Var6 = pdu->len == 0xc;
    break;
  case RESET_QUERY:
    _Var6 = pdu->len == 8;
    break;
  case CACHE_RESPONSE:
    _Var6 = pdu->len == 8;
    break;
  case IPV4_PREFIX:
    _Var6 = pdu->len == 0x14;
    break;
  case RESERVED:
  default:
    lrtr_dbg("RTR Socket: PDU type is unknown or reserved!");
    _Var6 = false;
    break;
  case IPV6_PREFIX:
    _Var6 = pdu->len == 0x20;
    break;
  case EOD:
    if (((pdu->ver == '\0') && (pdu->len == 0xc)) ||
       (((pdu->ver == '\x01' || (pdu->ver == '\x02')) && (pdu->len == 0x18)))) {
      _Var6 = true;
    }
    break;
  case CACHE_RESET:
    _Var6 = pdu->len == 8;
    break;
  case ROUTER_KEY:
    _Var6 = pdu->len == 0x7b;
    break;
  case ERROR:
    if (pdu->len < 0x10) {
      lrtr_dbg("RTR Socket: PDU is too small to contain \"Length of Error Text\" field!");
    }
    else {
      uVar4._0_1_ = pdu[1].ver;
      uVar4._1_1_ = pdu[1].type;
      uVar4._2_2_ = pdu[1].reserved;
      uVar4 = ntohl(uVar4);
      lrtr_dbg("RTR Socket: enc_pdu_len: %u",(ulong)uVar4);
      if ((ulong)pdu->len < (ulong)uVar4 + 0x10) {
        lrtr_dbg("RTR Socket: PDU is too small to contain erroneous PDU!");
      }
      else {
        uVar5 = ntohl(*(uint32_t *)((long)&pdu[1].len + (ulong)uVar4));
        lrtr_dbg("RTR Socket: err_msg_len: %u",(ulong)uVar5);
        if ((ulong)pdu->len == (ulong)uVar5 + (ulong)uVar4 + 0x10) {
          _Var6 = true;
        }
        else {
          lrtr_dbg("RTR Socket: PDU is too small to contain error_msg!");
        }
      }
    }
    break;
  case ASPA:
    if (pdu->len < 0x10) {
      lrtr_dbg("RTR Socket: PDU is too small to contain ASPA PDU!");
    }
    else {
      uVar2 = ntohs(pdu[1].reserved);
      if (pdu->len == (uint)uVar2 * 4 + 0x10) {
        _Var6 = true;
      }
      else {
        lrtr_dbg(
                "RTR Socket: The PDU is malformed, because the specified size doesn\'t match the real PDU size."
                );
      }
    }
  }
  if (_Var6 == false) {
    lrtr_dbg("RTR Socket: Received malformed PDU!");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return _Var6;
}

Assistant:

static bool rtr_pdu_check_size(const struct pdu_header *pdu)
{
	const enum pdu_type type = rtr_get_pdu_type(pdu);
	const struct pdu_error *err_pdu = NULL;
	const struct pdu_aspa *aspa_pdu = NULL;
	bool retval = false;
	size_t expected_size = 0;

	switch (type) {
	case SERIAL_NOTIFY:
		if (sizeof(struct pdu_serial_notify) == pdu->len)
			retval = true;
		break;
	case CACHE_RESPONSE:
		if (sizeof(struct pdu_cache_response) == pdu->len)
			retval = true;
		break;
	case IPV4_PREFIX:
		if (sizeof(struct pdu_ipv4) == pdu->len)
			retval = true;
		break;
	case IPV6_PREFIX:
		if (sizeof(struct pdu_ipv6) == pdu->len)
			retval = true;
		break;
	case EOD:
		if ((pdu->ver == RTR_PROTOCOL_VERSION_0 && (sizeof(struct pdu_end_of_data_v0) == pdu->len)) ||
		    ((pdu->ver == RTR_PROTOCOL_VERSION_1 || pdu->ver == RTR_PROTOCOL_VERSION_2) &&
		     (sizeof(struct pdu_end_of_data_v1_v2) == pdu->len))) {
			retval = true;
		}
		break;
	case CACHE_RESET:
		if (sizeof(struct pdu_header) == pdu->len)
			retval = true;
		break;
	case ROUTER_KEY:
		if (sizeof(struct pdu_router_key) == pdu->len)
			retval = true;
		break;
	case ERROR:
		err_pdu = (const struct pdu_error *)pdu;
		// +4 because of the "Length of Error Text" field
		expected_size = 4 + sizeof(struct pdu_error);
		if (err_pdu->len < expected_size) {
			RTR_DBG1("PDU is too small to contain \"Length of Error Text\" field!");
			break;
		}

		// Check if the PDU really contains the error PDU
		uint32_t enc_pdu_len = ntohl(err_pdu->len_enc_pdu);

		RTR_DBG("enc_pdu_len: %u", enc_pdu_len);
		expected_size += enc_pdu_len;
		if (err_pdu->len < expected_size) {
			RTR_DBG1("PDU is too small to contain erroneous PDU!");
			break;
		}

		// Check if the the PDU really contains the error msg
		uint32_t err_msg_len = ntohl(*((uint32_t *)(err_pdu->rest + enc_pdu_len)));

		RTR_DBG("err_msg_len: %u", err_msg_len);
		expected_size += err_msg_len;
		if (err_pdu->len != expected_size) {
			RTR_DBG1("PDU is too small to contain error_msg!");
			break;
		}

		retval = true;
		break;
	case SERIAL_QUERY:
		if (sizeof(struct pdu_serial_query) == pdu->len)
			retval = true;
		break;
	case RESET_QUERY:
		if (sizeof(struct pdu_reset_query) == pdu->len)
			retval = true;
		break;
	case ASPA:
		aspa_pdu = (const struct pdu_aspa *)pdu;
		expected_size = sizeof(struct pdu_aspa);
		if (aspa_pdu->len < expected_size) {
			RTR_DBG1("PDU is too small to contain ASPA PDU!");
			break;
		}

		// Check if the PDU really contains the ASPA PDU
		uint16_t asn_count = ntohs(aspa_pdu->provider_count);

		// ASN is 4 bytes each
		expected_size += asn_count * sizeof(aspa_pdu->provider_asns[0]);
		if (aspa_pdu->len != expected_size) {
			RTR_DBG1("The PDU is malformed, because the specified size doesn't match the real PDU size.");
			break;
		}

		retval = true;
		break;
	case RESERVED:
	default:
		RTR_DBG1("PDU type is unknown or reserved!");
		retval = false;
		break;
	}

#ifndef NDEBUG
	if (!retval)
		RTR_DBG1("Received malformed PDU!");
#endif

	return retval;
}